

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O1

void gai_setup_2d_patch(Integer rank,char *trans,Integer *dims,Integer *lo,Integer *hi,Integer *ilo,
                       Integer *ihi,Integer *jlo,Integer *jhi,Integer *dim1,Integer *dim2,int *ipos,
                       int *jpos,int *vpos,int vec_idx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  byte bVar7;
  
  uVar2 = 0;
  if (0 < rank) {
    lVar5 = 0;
    do {
      if ((lo[lVar5] < hi[lVar5]) &&
         (uVar4 = uVar2 + 1, bVar1 = 1 < (int)uVar2, uVar2 = uVar4, bVar1)) {
        pnga_error("3-D Patch Detected",0);
      }
      lVar5 = lVar5 + 1;
    } while (rank != lVar5);
    uVar2 = (uint)(uVar2 == 1);
  }
  *vpos = -1;
  *jpos = -1;
  *ipos = -1;
  if (0 < rank) {
    iVar6 = *ipos;
    lVar5 = 0;
    do {
      iVar3 = (int)lVar5;
      if ((iVar6 < 0) && (lo[lVar5] < hi[lVar5])) {
        *ipos = iVar3;
        iVar6 = iVar3;
      }
      else if ((-1 < iVar6) && (lo[lVar5] < hi[lVar5])) {
        *jpos = iVar3;
        break;
      }
      lVar5 = lVar5 + 1;
    } while (rank != lVar5);
  }
  if (((char)uVar2 != '\0') && (iVar6 = *ipos, rank + -1 != (long)iVar6 && iVar6 != 0)) {
    *vpos = iVar6;
  }
  iVar6 = *ipos;
  if (((long)iVar6 < 0) && (*jpos < 0)) {
    *ipos = 0;
LAB_00128406:
    *jpos = 1;
  }
  else {
    if (trans == (char *)0x0) {
      bVar7 = 0x6e;
    }
    else {
      bVar7 = *trans;
    }
    if ((bVar7 | 0x20) == 0x6e) {
      if (rank + -1 == (long)iVar6) {
        *ipos = iVar6 + -1;
      }
      if (*ipos < 0) {
        *ipos = *jpos + -1;
      }
      if (*jpos < 0) {
        *jpos = *ipos + 1;
      }
      goto LAB_0012840c;
    }
    if (iVar6 < 0) {
      *ipos = *jpos + -1;
    }
    if (-1 < *jpos) goto LAB_0012840c;
    iVar6 = *ipos;
    if (vec_idx < 0) {
      if (iVar6 == 0) goto LAB_00128406;
      *ipos = iVar6 + -1;
    }
    else {
      if (iVar6 < vec_idx) {
        *jpos = vec_idx;
        goto LAB_0012840c;
      }
      if (vec_idx < iVar6) {
        *jpos = iVar6;
        *ipos = vec_idx;
        goto LAB_0012840c;
      }
      if (iVar6 < 1) {
        *jpos = 1;
        *ipos = 0;
        goto LAB_0012840c;
      }
    }
    *jpos = iVar6;
  }
LAB_0012840c:
  iVar6 = *ipos;
  *ilo = lo[iVar6];
  *ihi = hi[iVar6];
  iVar3 = *jpos;
  *jlo = lo[iVar3];
  *jhi = hi[iVar3];
  *dim1 = dims[iVar6];
  *dim2 = dims[iVar3];
  return;
}

Assistant:

static void  gai_setup_2d_patch(Integer rank, char *trans, Integer dims[],
                                Integer lo[], Integer hi[],
                                Integer* ilo, Integer* ihi,
                                Integer* jlo, Integer* jhi,
                                Integer* dim1, Integer* dim2,
                                int* ipos, int* jpos, int *vpos, int vec_idx)
{
    int d,e=0,f=0;
    char t='n';
    int reset_t = 0;
    int tmp;
    
    /* check to see if more than two dimensions of patch have
     * size greater than 1*/
    for(d=0; d<rank; d++)
       if( (hi[d]-lo[d])>0 && ++e>2 ) pnga_error("3-D Patch Detected", 0L);
    /* determine two locations where patch dimensions are greater than 1*/
    *ipos = *jpos = *vpos = -1;
    for(d=0; d<rank; d++){
       if( (*ipos <0) && (hi[d]>lo[d]) ) { *ipos =d; continue; }
       if( (*ipos >=0) && (hi[d]>lo[d])) { *jpos =d; break; }
    }
    /* we have an ambiguous vector; mark its location */
    if (1 == e && *ipos != 0 && *ipos != rank-1) {
        *vpos = *ipos;
    }

    /*    if(*ipos >*jpos){Integer t=*ipos; *ipos=*jpos; *jpos=t;} 
     */
    
    /* single element case (trivial) */
    if((*ipos <0) && (*jpos <0)){ *ipos =0; *jpos=1; }
    else{
       
       if(trans == NULL) {
         trans = &t;      
         reset_t = 1;
       }
       /* handle almost trivial case of only one dimension with >1 elements.
        * None of the conditions in this block are true for a 2D block with more
        * than 1 element in each of the 2 dimensions so no need to specify
        * condition that e == 1 */
       if(*trans == 'n' || *trans == 'N') {
          if(*ipos == rank-1) (*ipos)--; /* i cannot be the last dimension */
          if(*ipos <0) *ipos = *jpos-1; /* select i dimension based on j */
          if(*jpos <0) *jpos = *ipos+1; /* select j dimenison based on i */
       }
       else {
          if(*ipos <0) *ipos = *jpos-1; /* this condition is probably never reached */
          if(*jpos <0) {
            if (vec_idx < 0) {
              if(*ipos==0) *jpos = *ipos + 1; 
              else         *jpos = (*ipos)--;
            } else {
              if (*ipos < vec_idx) {
                *jpos = vec_idx;
              } else if (*ipos > vec_idx) {
                *jpos = *ipos;
                *ipos = vec_idx;
              } else {
                /* this is probably an error if you get this far */
                if (*ipos > 0) {
                  *jpos = *ipos;
		  // fix for -Wunused             *ipos--;
                } else {
                  *jpos = 1;
                  *ipos = 0;
                }
              }
            }
          }
       }
       if (reset_t) trans = NULL;
    }
    
    *ilo = lo[*ipos]; *ihi = hi[*ipos];
    *jlo = lo[*jpos]; *jhi = hi[*jpos];
    *dim1 = dims[*ipos];
    *dim2 = dims[*jpos];
#if 0
    printf("lo/hi=[%ld:%ld", lo[0], hi[0]);
    for (d=1; d<rank; ++d) {
        printf(",%ld:%ld", lo[d], hi[d]);
    }
    printf("]\n");
    printf("size=[%ld", hi[0]-lo[0]+1);
    for (d=1; d<rank; ++d) {
        printf(",%ld", hi[d]-lo[d]+1);
    }
    printf("]\n");
    printf("gai_setup_2d_patch(%ld, T, X, X, X, %ld, %ld, %ld, %ld, %ld, %ld, %d, %d, %d)\n",
            rank, *ilo, *ihi, *jlo, *jhi, *dim1, *dim2, *ipos, *jpos, *vpos);
#endif
}